

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeGapGrayCode.cpp
# Opt level: O0

double __thiscall
LargeGapGrayCode::computeGapVariance
          (LargeGapGrayCode *this,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *runLengths)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  pointer ppVar4;
  double dVar5;
  double dVar6;
  double variance;
  _Self local_48;
  const_iterator it_1;
  int squaredDiff;
  double mean;
  _Self local_28;
  const_iterator it;
  int runs;
  int sum;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *runLengths_local;
  LargeGapGrayCode *this_local;
  
  it._M_node._4_4_ = 0;
  it._M_node._0_4_ = 0;
  local_28._M_node =
       (_Base_ptr)
       std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::begin
                 (runLengths);
  while( true ) {
    mean = (double)std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                   end(runLengths);
    bVar3 = std::operator!=(&local_28,(_Self *)&mean);
    if (!bVar3) break;
    ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator->(&local_28);
    iVar1 = ppVar4->first;
    ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator->(&local_28);
    it._M_node._4_4_ = iVar1 * ppVar4->second + it._M_node._4_4_;
    ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator->(&local_28);
    it._M_node._0_4_ = ppVar4->second + (int)it._M_node;
    std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator++(&local_28);
  }
  dVar5 = (double)it._M_node._4_4_;
  dVar6 = (double)(int)it._M_node;
  it_1._M_node._4_4_ = 0;
  local_48._M_node =
       (_Base_ptr)
       std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::begin
                 (runLengths);
  while( true ) {
    variance = (double)std::
                       map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                       end(runLengths);
    bVar3 = std::operator!=(&local_48,(_Self *)&variance);
    if (!bVar3) break;
    ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator->(&local_48);
    iVar1 = ppVar4->first;
    ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator->(&local_48);
    iVar2 = ppVar4->first;
    ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator->(&local_48);
    it_1._M_node._4_4_ =
         (int)(((double)iVar1 - dVar5 / dVar6) * ((double)iVar2 - dVar5 / dVar6) *
               (double)ppVar4->second + (double)it_1._M_node._4_4_);
    std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator++(&local_48);
  }
  return (double)it_1._M_node._4_4_ / (double)(int)it._M_node;
}

Assistant:

double LargeGapGrayCode::computeGapVariance(const std::map<int, int>& runLengths)
{
	int sum = 0;
	int runs = 0;

	for(std::map<int, int>::const_iterator it = runLengths.begin(); it != runLengths.end(); ++it) {
		sum += it->first * it->second;
		runs += it->second;
	}

	double mean = (double)sum/runs;

	int squaredDiff = 0;
	for(std::map<int, int>::const_iterator it = runLengths.begin(); it != runLengths.end(); ++it) {
		squaredDiff += (it->first-mean)*(it->first-mean) * it->second;
	}

	double variance = (double)squaredDiff/runs;

	return variance;
}